

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageoutput.cc
# Opt level: O3

unique_ptr<ImageOutput,_std::default_delete<ImageOutput>_> ImageOutput::create(string *filename)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  iterator iVar2;
  pointer pcVar3;
  runtime_error *prVar4;
  pointer *__ptr;
  long *in_RSI;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  string format;
  string local_a8;
  key_type local_88;
  string local_68;
  long local_48;
  long lStack_40;
  
  if (in_RSI[1] == 0) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,"ImageOutput::create() called with no filename");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (Imageio::outputFormats_abi_cxx11_._40_8_ == 0) {
    Imageio::catalogBuiltinPlugins();
    if (Imageio::outputFormats_abi_cxx11_._40_8_ == 0) {
      __assert_fail("!Imageio::outputFormats.empty() && \"No image output plugins compiled in.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/imageoutput.cc"
                    ,0x2b,
                    "static std::unique_ptr<ImageOutput> ImageOutput::create(const std::string &)");
    }
  }
  std::__cxx11::string::rfind((char)in_RSI,0x2e);
  std::__cxx11::string::substr((ulong)&local_a8,(ulong)in_RSI);
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,local_a8._M_dataplus._M_p,
             local_a8._M_dataplus._M_p + local_a8._M_string_length);
  paVar1 = &local_a8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if (local_88._M_string_length == 0) {
    local_a8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>((string *)&local_a8,*in_RSI,in_RSI[1] + *in_RSI);
    std::__cxx11::string::operator=((string *)&local_88,(string *)&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
  }
  Imageio::string::tolower(&local_68,(int)&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.super_string._M_dataplus._M_p != &local_68.super_string.field_2) {
    operator_delete(local_68.super_string._M_dataplus._M_p,
                    local_68.super_string.field_2._M_allocated_capacity + 1);
  }
  iVar2 = Imageio::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)()>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)()>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)()>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)()>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)()>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ImageOutput_*(*)()>_>_>
                  *)Imageio::outputFormats_abi_cxx11_,&local_88);
  if (iVar2._M_node != (_Base_ptr)(Imageio::outputFormats_abi_cxx11_ + 8)) {
    if (*(code **)(iVar2._M_node + 2) != (code *)0x0) {
      pcVar3 = (pointer)(**(code **)(iVar2._M_node + 2))();
      (filename->_M_dataplus)._M_p = pcVar3;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      return (__uniq_ptr_data<ImageOutput,_std::default_delete<ImageOutput>,_true,_true>)
             (__uniq_ptr_data<ImageOutput,_std::default_delete<ImageOutput>,_true,_true>)filename;
    }
    __assert_fail("createFunction != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/imageoutput.cc"
                  ,0x44,
                  "static std::unique_ptr<ImageOutput> ImageOutput::create(const std::string &)");
  }
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_48 = *in_RSI;
  lStack_40 = in_RSI[1];
  fmt.size_ = 0xd;
  fmt.data_ = (char *)0x56;
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)&local_48;
  ::fmt::v10::vformat_abi_cxx11_
            (&local_a8,
             (v10 *)
             "Could not find a format writer for \"{}\". Is it a file format that we don\'t know about?"
             ,fmt,args);
  std::runtime_error::runtime_error(prVar4,(string *)&local_a8);
  __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::unique_ptr<ImageOutput>
ImageOutput::create(const std::string& filename)
{
    std::unique_ptr<ImageOutput> out;
    if (filename.empty()) {  // Can't even guess if no name given
        throw std::runtime_error(
            "ImageOutput::create() called with no filename"
        );
    }

    // Populate outputFormats.
    if (Imageio::outputFormats.empty()) {
        Imageio::catalogBuiltinPlugins();
        assert(!Imageio::outputFormats.empty()
               && "No image output plugins compiled in.");
    }

    // Extract the file extension from the filename (without the leading dot)
    Imageio::string format = filename.substr(filename.find_last_of('.')+1);
    if (format.empty()) {
        // If the file had no extension, maybe it was itself the format name
        format = filename;
    }
    format.tolower();

    ImageOutput::Creator createFunction = nullptr;
    // See if it's already in the table.  If not, scan all plugins we can
    // find to populate the table.
    Imageio::OutputPluginMap::const_iterator found
            = Imageio::outputFormats.find(format);
    if (found != Imageio::outputFormats.end()) {
        createFunction = found->second;
    } else {
        throw std::runtime_error(
            fmt::format("Could not find a format writer for \"{}\". "
                    "Is it a file format that we don't know about?",
                    filename));
    }

    assert(createFunction != nullptr);
    out = std::unique_ptr<ImageOutput>(createFunction());
    return out;
}